

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::UdpPortListSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if (((kind == AnsiUdpPortList) || (kind == NonAnsiUdpPortList)) || (kind == WildcardUdpPortList))
  {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool UdpPortListSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AnsiUdpPortList:
        case SyntaxKind::NonAnsiUdpPortList:
        case SyntaxKind::WildcardUdpPortList:
            return true;
        default:
            return false;
    }
}